

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O1

Variable __thiscall
LiteScript::_Type_CHARACTER::OAddAndAssign(_Type_CHARACTER *this,Variable *obj1,Variable *obj2)

{
  String *pSVar1;
  bool bVar2;
  Object *pOVar3;
  Type *pTVar4;
  Type *in_RCX;
  uint *extraout_RDX;
  uint *extraout_RDX_00;
  uint *puVar5;
  Variable VVar6;
  Variable tmp;
  Variable VStack_58;
  String local_48;
  
  pOVar3 = Variable::operator->((Variable *)in_RCX);
  pTVar4 = Object::GetType(pOVar3);
  bVar2 = Type::operator!=(pTVar4,(Type *)_type_string);
  if (bVar2) {
    Variable::Convert(&VStack_58,in_RCX);
    pOVar3 = Variable::operator->(&VStack_58);
    pTVar4 = Object::GetType(pOVar3);
    bVar2 = Type::operator==(pTVar4,(Type *)_type_string);
    if (bVar2) {
      pOVar3 = Variable::operator->(&VStack_58);
      pSVar1 = (String *)pOVar3->data;
      pOVar3 = Variable::operator->(obj2);
      Character::operator+=((Character *)pOVar3->data,pSVar1);
    }
    else {
      String::String(&local_48,"");
      pOVar3 = Variable::operator->(obj2);
      Character::operator+=((Character *)pOVar3->data,&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
           *)local_48.str._M_dataplus._M_p != &local_48.str.field_2) {
        operator_delete(local_48.str._M_dataplus._M_p);
      }
    }
    Variable::Variable((Variable *)this,obj2);
    Variable::~Variable(&VStack_58);
    puVar5 = extraout_RDX_00;
  }
  else {
    pOVar3 = Variable::operator->((Variable *)in_RCX);
    pSVar1 = (String *)pOVar3->data;
    pOVar3 = Variable::operator->(obj2);
    Character::operator+=((Character *)pOVar3->data,pSVar1);
    Variable::Variable((Variable *)this,obj2);
    puVar5 = extraout_RDX;
  }
  VVar6.nb_ref = puVar5;
  VVar6.obj = (Object *)this;
  return VVar6;
}

Assistant:

LiteScript::Variable LiteScript::_Type_CHARACTER::OAddAndAssign(LiteScript::Variable& obj1, const LiteScript::Variable& obj2) const {
    if (obj2->GetType() != Type::STRING) {
        Variable tmp = obj2.Convert(Type::STRING);
        if (tmp->GetType() == Type::STRING) {
            obj1->GetData<Character>() += tmp->GetData<String>();
            return obj1;
        }
        obj1->GetData<Character>() += String("");
        return obj1;
    }
    obj1->GetData<Character>() += obj2->GetData<String>();
    return obj1;
}